

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# final_contours_extract_features.cpp
# Opt level: O3

void thresh_callback(int param_1,void *param_2)

{
  undefined8 uVar1;
  Size SVar2;
  pointer pMVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  pointer pvVar7;
  _InputArray *p_Var8;
  ulong uVar9;
  long lVar10;
  pointer pvVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  Point_<float> PVar15;
  undefined1 auVar16 [16];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  char str2 [5];
  char str1 [7];
  Scalar color;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> boundRect;
  vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_> hierarchy;
  vector<float,_std::allocator<float>_> radius;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours_poly;
  vector<cv::Moments,_std::allocator<cv::Moments>_> mu;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> center_contours;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> center;
  Mat drawing;
  vector<cv::Mat,_std::allocator<cv::Mat>_> contourRegion;
  vector<cv::Mat,_std::allocator<cv::Mat>_> images;
  Mat overlap;
  Mat area;
  Mat cropped;
  Mat area1;
  Mat threshold_output;
  uint local_54c;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_548;
  char local_530 [8];
  _OutputArray local_528;
  char local_510 [8];
  undefined1 local_508 [8];
  undefined8 local_500;
  undefined1 local_4f8 [8];
  Size SStack_4f0;
  uchar *local_4e8;
  uchar *puStack_4e0;
  MatAllocator *local_4d8;
  UMatData *pUStack_4d0;
  MatSize local_4c8;
  UMatData *local_4c0;
  MatSize local_4b8;
  size_t *psStack_4b0;
  Mat local_498;
  Mat local_438;
  _InputArray local_3a8;
  undefined8 local_390;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_388;
  int local_370;
  int local_36c;
  void *local_368;
  undefined8 uStack_360;
  long local_358;
  vector<float,_std::allocator<float>_> local_348;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_330;
  undefined8 local_318;
  vector<cv::Moments,_std::allocator<cv::Moments>_> local_310;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_2f8;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_2e0;
  undefined1 local_2c8 [16];
  Size local_2b8;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_268;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_248;
  undefined1 local_230 [12];
  int iStack_224;
  Size local_220;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [16];
  Size local_1b0;
  size_t *local_178;
  undefined8 local_160;
  undefined1 local_158 [8];
  void *pvStack_150;
  Size local_148;
  undefined1 local_f0 [16];
  Size local_e0;
  size_t *local_a8;
  Mat local_90;
  
  cv::Mat::Mat(&local_90);
  local_548.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_548.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_548.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358 = 0;
  local_368 = (void *)0x0;
  uStack_360 = 0;
  local_268.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_268.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_268.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_4f8._0_4_ = 0;
  local_4f8._4_4_ = 0;
  local_508._0_4_ = 0x1010000;
  local_500 = &src_gray;
  local_1c0._8_8_ = local_2c8;
  local_2c8._0_4_ = 0;
  local_2c8._4_4_ = 0x40240000;
  local_1c0._0_4_ = -0x3efdfffa;
  local_1b0.width = 1;
  local_1b0.height = 1;
  pvStack_150 = local_230;
  local_230._0_4_ = 0;
  local_230._4_4_ = 0x40590000;
  local_158._0_4_ = -0x3efdfffa;
  local_148.width = 1;
  local_148.height = 1;
  local_e0.width = 0;
  local_e0.height = 0;
  local_f0._0_4_ = 0x2010000;
  local_f0._8_8_ = &local_90;
  cv::inRange((_InputArray *)local_508,(_InputArray *)local_1c0,(_InputArray *)local_158,
              (_OutputArray *)local_f0);
  local_508 = (undefined1  [8])local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"thresh","");
  local_1b0.width = 0;
  local_1b0.height = 0;
  local_1c0._0_4_ = 0x1010000;
  local_1c0._8_8_ = &local_90;
  cv::imshow((string *)local_508,(_InputArray *)local_1c0);
  if (local_508 != (undefined1  [8])local_4f8) {
    operator_delete((void *)local_508,(long)local_4f8 + 1);
  }
  local_508 = (undefined1  [8])local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"middle.jpg","");
  local_1b0.width = 0;
  local_1b0.height = 0;
  local_1c0._0_4_ = 0x1010000;
  local_148.width = 0;
  local_148.height = 0;
  local_158 = (undefined1  [8])0x0;
  pvStack_150 = (void *)0x0;
  local_1c0._8_8_ = &local_90;
  cv::imwrite((string *)local_508,(_InputArray *)local_1c0,(vector *)local_158);
  if (local_158 != (undefined1  [8])0x0) {
    operator_delete((void *)local_158,(long)local_148 - (long)local_158);
  }
  if (local_508 != (undefined1  [8])local_4f8) {
    operator_delete((void *)local_508,(long)local_4f8 + 1);
  }
  local_4f8._0_4_ = 0;
  local_4f8._4_4_ = 0;
  local_508._0_4_ = 0x1010000;
  local_1b0.width = 0;
  local_1b0.height = 0;
  local_1c0._0_4_ = -0x7dfbfff4;
  local_1c0._8_8_ = &local_548;
  local_148.width = 0;
  local_148.height = 0;
  local_158._0_4_ = -0x7dfcffe4;
  pvStack_150 = &local_368;
  local_160 = 0;
  local_500 = &local_90;
  cv::findContours();
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector(&local_330,
           ((long)local_548.
                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_548.
                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)local_508);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            (&local_388,
             ((long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_508);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            (&local_2e0,
             ((long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_508);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            (&local_2f8,
             ((long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_508);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_348,
             ((long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_508);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            (&local_248,
             ((long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_508);
  std::vector<cv::Moments,_std::allocator<cv::Moments>_>::vector
            (&local_310,
             ((long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_508);
  cv::Mat::zeros((int)local_508,
                 (int)((ulong)((long)local_548.
                                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_548.
                                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555,2
                );
  cv::Mat::Mat((Mat *)local_1c0);
  (**(code **)(*(long *)local_508 + 0x18))(local_508,local_508,(Mat *)local_1c0,0xffffffff);
  cv::Mat::~Mat(&local_438);
  cv::Mat::~Mat(&local_498);
  cv::Mat::~Mat((Mat *)local_4f8);
  cv::Mat::Mat((Mat *)local_158);
  cv::Mat::zeros((int)local_508,
                 (int)((ulong)((long)local_548.
                                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_548.
                                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555,2
                );
  cv::Mat::Mat((Mat *)local_f0);
  (**(code **)(*(long *)local_508 + 0x18))(local_508,local_508,(Mat *)local_f0,0xffffffff);
  cv::Mat::~Mat(&local_438);
  cv::Mat::~Mat(&local_498);
  cv::Mat::~Mat((Mat *)local_4f8);
  if ((thresh_callback(int,void*)::oss_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&thresh_callback(int,void*)::oss_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&thresh_callback(int,void*)::oss_abi_cxx11_);
    __cxa_atexit(std::__cxx11::stringstream::~stringstream,
                 &thresh_callback(int,void*)::oss_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&thresh_callback(int,void*)::oss_abi_cxx11_);
  }
  builtin_strncpy(local_510,"result",7);
  builtin_strncpy(local_530,".jpg",5);
  if (local_548.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_548.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar12 = 0;
    do {
      local_508._0_4_ = 0x42ff400c;
      local_508._4_4_ = 2;
      uVar9 = (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar12].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar12].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_500 = (Mat *)CONCAT44(1,(int)(uVar9 >> 3));
      local_4d8 = (MatAllocator *)0x0;
      pUStack_4d0 = (UMatData *)0x0;
      puStack_4e0 = (uchar *)0x0;
      SStack_4f0.width = 0;
      SStack_4f0.height = 0;
      local_4c0 = (UMatData *)&local_4b8;
      local_4b8.p = (int *)0x0;
      psStack_4b0 = (size_t *)0x0;
      SVar2 = *(Size *)(local_548.
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar12);
      if (SVar2 != (Size)local_548.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar12].
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish) {
        psStack_4b0 = (size_t *)0x8;
        local_4b8.p = (int *)0x8;
        puStack_4e0 = (uchar *)(((long)(uVar9 * 0x20000000) >> 0x1d & 0xfffffffffffffff8U) +
                               (long)SVar2);
        SStack_4f0 = SVar2;
      }
      local_2b8.width = 0;
      local_2b8.height = 0;
      local_2c8._0_4_ = 0x1010000;
      register0x00000000 =
           local_330.
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + uVar12;
      local_220.width = 0;
      local_220.height = 0;
      local_230._0_4_ = -0x7dfcfff4;
      local_4f8 = (undefined1  [8])SStack_4f0;
      local_4e8 = puStack_4e0;
      local_4c8.p = (int *)&local_500;
      local_2c8._8_8_ = (Mat *)local_508;
      cv::approxPolyDP((_InputArray *)local_2c8,(_OutputArray *)local_230,3.0,true);
      cv::Mat::~Mat((Mat *)local_508);
      local_508._0_4_ = 0x42ff400c;
      local_508._4_4_ = 2;
      uVar9 = (long)local_330.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar12].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_330.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar12].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_500 = (Mat *)CONCAT44(1,(int)(uVar9 >> 3));
      local_4d8 = (MatAllocator *)0x0;
      pUStack_4d0 = (UMatData *)0x0;
      puStack_4e0 = (uchar *)0x0;
      SStack_4f0.width = 0;
      SStack_4f0.height = 0;
      local_4c0 = (UMatData *)&local_4b8;
      local_4b8.p = (int *)0x0;
      psStack_4b0 = (size_t *)0x0;
      SVar2 = *(Size *)(local_330.
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar12);
      if (SVar2 != (Size)local_330.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar12].
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish) {
        psStack_4b0 = (size_t *)0x8;
        local_4b8.p = (int *)0x8;
        puStack_4e0 = (uchar *)(((long)(uVar9 * 0x20000000) >> 0x1d & 0xfffffffffffffff8U) +
                               (long)SVar2);
        SStack_4f0 = SVar2;
      }
      local_2b8.width = 0;
      local_2b8.height = 0;
      local_2c8._0_4_ = 0x1010000;
      local_4f8 = (undefined1  [8])SStack_4f0;
      local_4e8 = puStack_4e0;
      local_4c8.p = (int *)&local_500;
      local_2c8._8_8_ = (Mat *)local_508;
      cv::boundingRect((_InputArray *)local_230);
      local_388.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12].x = local_230._0_4_;
      local_388.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12].y = local_230._4_4_;
      local_388.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12].width = local_230._8_4_;
      local_388.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12].height = iStack_224;
      cv::Mat::~Mat((Mat *)local_508);
      lVar10 = *local_178 * (long)(int)uVar12;
      *(float *)((long)local_1b0 + lVar10) = (float)uVar12;
      *(float *)((long)local_1b0 + 4 + lVar10) =
           (float)local_388.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar12].height *
           (float)local_388.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar12].width;
      local_500 = (Mat *)(local_330.
                          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar12);
      local_4f8._0_4_ = 0;
      local_4f8._4_4_ = 0;
      local_508._0_4_ = 0x8103000c;
      cv::minEnclosingCircle
                ((_InputArray *)local_508,
                 (Point_ *)
                 (local_2e0.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start + uVar12),
                 local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar12);
      lVar10 = (long)(int)uVar12 * *local_a8;
      *(float *)((long)local_e0 + lVar10) = (float)uVar12;
      *(float *)((long)local_e0 + 4 + lVar10) =
           local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar12] *
           local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar12];
      local_2c8._8_8_ =
           local_330.
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + uVar12;
      local_2b8.width = 0;
      local_2b8.height = 0;
      local_2c8._0_4_ = -0x7efcfff4;
      cv::moments((_InputArray *)local_508,SUB81(local_2c8,0));
      pMVar3 = local_310.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = uVar12 * 0xc0;
      memcpy(local_310.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>._M_impl.
             super__Vector_impl_data._M_start + lVar10,(_InputArray *)local_508,0xc0);
      uVar1 = *(undefined8 *)(pMVar3 + lVar10);
      auVar16._8_8_ = uVar1;
      auVar16._0_8_ = uVar1;
      auVar16 = divpd(*(undefined1 (*) [16])(pMVar3 + lVar10 + 8),auVar16);
      PVar15.x = (float)auVar16._0_8_;
      PVar15.y = (float)auVar16._8_8_;
      local_2f8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12] = PVar15;
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)(((long)local_548.
                                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_548.
                                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  local_1c8 = CONCAT44((int)*(undefined8 *)local_90.size.p,
                       (int)((ulong)*(undefined8 *)local_90.size.p >> 0x20));
  cv::Mat::zeros(local_508,&local_1c8,0x10);
  cv::Mat::Mat((Mat *)local_2c8);
  (**(code **)(*(long *)local_508 + 0x18))(local_508,local_508,(Mat *)local_2c8,0xffffffff);
  cv::Mat::~Mat(&local_438);
  cv::Mat::~Mat(&local_498);
  cv::Mat::~Mat((Mat *)local_4f8);
  local_1d0 = CONCAT44((int)*(undefined8 *)local_90.size.p,
                       (int)((ulong)*(undefined8 *)local_90.size.p >> 0x20));
  cv::Mat::zeros(local_508,&local_1d0,0x10);
  cv::Mat::Mat((Mat *)local_230);
  (**(code **)(*(long *)local_508 + 0x18))(local_508,local_508,(Mat *)local_230,0xffffffff);
  cv::Mat::~Mat(&local_438);
  cv::Mat::~Mat(&local_498);
  cv::Mat::~Mat((Mat *)local_4f8);
  if (local_548.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_548.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_54c = 0;
  }
  else {
    lVar10 = 0;
    lVar14 = 0;
    lVar13 = 0;
    uVar12 = 0;
    local_54c = 0;
    pvVar7 = local_548.
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar11 = local_548.
              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      uVar9 = (rng.state >> 0x20) + (rng.state & 0xffffffff) * 0xf83f630a;
      local_3a8._0_8_ = (BADTYPE)((int)((uVar9 & 0xffffffff) / 0xff) * -0xff + (int)uVar9);
      uVar9 = (uVar9 >> 0x20) + (uVar9 & 0xffffffff) * 0xf83f630a;
      rng.state = (uVar9 >> 0x20) + (uVar9 & 0xffffffff) * 0xf83f630a;
      local_3a8.obj = (void *)(double)((int)((uVar9 & 0xffffffff) / 0xff) * -0xff + (int)uVar9);
      local_3a8.sz = (Size)(double)((int)((rng.state & 0xffffffff) / 0xff) * -0xff + (int)rng.state)
      ;
      local_390 = 0;
      if (1500.0 < *(float *)((long)local_1b0 + 4 + (lVar10 >> 0x20) * *local_178)) {
        local_4f8._0_4_ = 0;
        local_4f8._4_4_ = 0;
        local_508._0_4_ = 0x3010000;
        local_500 = (Mat *)local_2c8;
        uVar1 = *(undefined8 *)
                 ((long)&(local_388.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start)->x + lVar13);
        local_370 = (int)uVar1;
        local_36c = (int)((ulong)uVar1 >> 0x20);
        uVar1 = *(undefined8 *)
                 ((long)&(local_388.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start)->width + lVar13);
        local_318 = CONCAT44((int)((ulong)uVar1 >> 0x20) + local_36c,(int)uVar1 + local_370);
        cv::rectangle((Mat *)local_508,&local_370,&local_318,&local_3a8,2,8,0);
        cv::Mat::Mat((Mat *)local_508,&src,
                     (Rect_ *)((long)&(local_388.
                                       super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->x + lVar13));
        cv::Mat::operator=((Mat *)((long)&((Mat *)(&((Mat *)(&((Mat *)(&(local_248.
                                                                                                                                                  
                                                  super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->step +
                                                  -3))->step + -3))->step + -3))->step +
                                  lVar14 + 0xffffffffffffffb8U),(Mat *)local_508);
        cv::Mat::~Mat((Mat *)local_508);
        sVar5 = strlen(local_510);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DAT_00108328,local_510,sVar5)
        ;
        poVar6 = std::ostream::_M_insert<unsigned_long>(0x108328);
        sVar5 = strlen(local_530);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_530,sVar5);
        std::__cxx11::stringbuf::str();
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_508,(long)local_500);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if (local_508 != (undefined1  [8])local_4f8) {
          operator_delete((void *)local_508,(long)local_4f8 + 1);
        }
        std::ios::clear((int)*(undefined8 *)(thresh_callback(int,void*)::oss_abi_cxx11_ + -0x18) +
                        0x108318);
        local_508 = (undefined1  [8])local_4f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"");
        std::__cxx11::stringbuf::str((string *)&DAT_00108330);
        if (local_508 != (undefined1  [8])local_4f8) {
          operator_delete((void *)local_508,(long)local_4f8 + 1);
        }
        local_54c = local_54c + 1;
        pvVar7 = local_548.
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar11 = local_548.
                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 0x10;
      lVar14 = lVar14 + 0x60;
      lVar10 = lVar10 + 0x100000000;
    } while (uVar12 < (ulong)(((long)pvVar11 - (long)pvVar7 >> 3) * -0x5555555555555555));
  }
  printf("count %d\n",(ulong)local_54c);
  local_508 = (undefined1  [8])local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"Contours","");
  cv::namedWindow((string *)local_508,1);
  if (local_508 != (undefined1  [8])local_4f8) {
    operator_delete((void *)local_508,(long)local_4f8 + 1);
  }
  local_508 = (undefined1  [8])local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"contours_.jpg","");
  local_3a8.sz.width = 0;
  local_3a8.sz.height = 0;
  local_3a8.flags = 0x1010000;
  local_3a8.obj = local_2c8;
  local_528.super__InputArray.sz.width = 0;
  local_528.super__InputArray.sz.height = 0;
  local_528.super__InputArray.flags = 0;
  local_528.super__InputArray._4_4_ = 0;
  local_528.super__InputArray.obj = (void *)0x0;
  cv::imwrite((string *)local_508,&local_3a8,(vector *)&local_528);
  if ((void *)local_528.super__InputArray._0_8_ != (void *)0x0) {
    operator_delete((void *)local_528.super__InputArray._0_8_,
                    (long)local_528.super__InputArray.sz - local_528.super__InputArray._0_8_);
  }
  if (local_508 != (undefined1  [8])local_4f8) {
    operator_delete((void *)local_508,(long)local_4f8 + 1);
  }
  local_4f8._0_4_ = 0;
  local_4f8._4_4_ = 0;
  local_508._0_4_ = 0x1010000;
  local_500 = &src;
  local_3a8.sz.width = 0;
  local_3a8.sz.height = 0;
  local_3a8.flags = 0x1010000;
  local_3a8.obj = local_2c8;
  local_528.super__InputArray.sz.width = 0;
  local_528.super__InputArray.sz.height = 0;
  local_528.super__InputArray.flags = 0x2010000;
  local_528.super__InputArray.obj = local_230;
  p_Var8 = (_InputArray *)cv::noArray();
  cv::add((_InputArray *)local_508,&local_3a8,&local_528,p_Var8,-1);
  local_508 = (undefined1  [8])local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"Contours","");
  local_3a8.sz.width = 0;
  local_3a8.sz.height = 0;
  local_3a8.flags = 0x1010000;
  local_3a8.obj = local_230;
  cv::imshow((string *)local_508,&local_3a8);
  if (local_508 != (undefined1  [8])local_4f8) {
    operator_delete((void *)local_508,(long)local_4f8 + 1);
  }
  local_508 = (undefined1  [8])local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"overlap.jpg","");
  local_3a8.sz.width = 0;
  local_3a8.sz.height = 0;
  local_3a8.flags = 0x1010000;
  local_528.super__InputArray.sz.width = 0;
  local_528.super__InputArray.sz.height = 0;
  local_528.super__InputArray.flags = 0;
  local_528.super__InputArray._4_4_ = 0;
  local_528.super__InputArray.obj = (void *)0x0;
  local_3a8.obj = local_230;
  cv::imwrite((string *)local_508,&local_3a8,(vector *)&local_528);
  if ((void *)local_528.super__InputArray._0_8_ != (void *)0x0) {
    operator_delete((void *)local_528.super__InputArray._0_8_,
                    (long)local_528.super__InputArray.sz - local_528.super__InputArray._0_8_);
  }
  if (local_508 != (undefined1  [8])local_4f8) {
    operator_delete((void *)local_508,(long)local_4f8 + 1);
  }
  cv::Mat::~Mat((Mat *)local_230);
  cv::Mat::~Mat((Mat *)local_2c8);
  cv::Mat::~Mat((Mat *)local_f0);
  cv::Mat::~Mat((Mat *)local_158);
  cv::Mat::~Mat((Mat *)local_1c0);
  if (local_310.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_310.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_310.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_310.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_248);
  if (local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2f8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f8.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_388.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_388.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_388.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_388.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_330);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_268);
  if (local_368 != (void *)0x0) {
    operator_delete(local_368,local_358 - (long)local_368);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_548);
  cv::Mat::~Mat(&local_90);
  return;
}

Assistant:

void thresh_callback(int, void* )
{
  Mat threshold_output;
  vector<vector<Point> > contours;
  vector<Vec4i> hierarchy;
  vector<Mat> contourRegion;
  float minArea= 1500.0;  // threshold for area-wise cleanup
  /// Detect edges using Threshold for user thresh i/p
// threshold( src_gray, threshold_output, thresh, 255, THRESH_BINARY );
	//adaptiveThreshold(src_gray, threshold_output, 255, ADAPTIVE_THRESH_GAUSSIAN_C, CV_THRESH_BINARY, 151, 0);
 // threshold( src_gray, threshold_output, 128, 255, THRESH_BINARY );
  inRange(src_gray, 10,100, threshold_output);
  imshow("thresh", threshold_output);
  imwrite("middle.jpg", threshold_output);
  //closing operation
//  dilate(threshold_output, threshold_output, cv::Mat(), cv::Point(-1,-1),3);
//  erode(threshold_output, threshold_output, cv::Mat(), cv::Point(-1,-1),3);
//  imshow("thresh_close", threshold_output);
  
  /// Find contours
  findContours( threshold_output, contours, hierarchy, RETR_TREE, CHAIN_APPROX_SIMPLE, Point(0, 0) );
  
  //variables for drawing and extraction
  vector<vector<Point> > contours_poly( contours.size() );
  vector<Rect> boundRect( contours.size() );
  vector<Point2f>center( contours.size() );	 // centers of the enclosing circles
  vector<Point2f>center_contours( contours.size() );	 // centers of the contours
  vector<float>radius( contours.size() );  //radii of the enclosing circles
  vector<Mat>images(contours.size()); // extracted images from bounding rectangles
  vector<Moments>mu(contours.size()); // moments of the contours
 
  Mat area = Mat::zeros(contours.size(), 2, CV_32F);
  Mat cropped;
  Mat area1 = Mat::zeros(contours.size(), 2, CV_32F);
  static std:: stringstream oss;
  int count_contours =0;  // contours with area greater than minArea 
  char destname[30]= "";
  const char  str1[7] = "result";
  const char str2[5] = ".jpg";
  
  /// Approximate contours to polygons + get bounding rects and circles
  for( size_t i = 0; i < contours.size(); i++ )
     { 
		approxPolyDP( Mat(contours[i]), contours_poly[i], 3, true );
        boundRect[i] = boundingRect( Mat(contours_poly[i]) );
	    // area of rectangles
	     area.at<float>(i,0)=(float)i;
		 area.at<float>(i,1)= (float)boundRect[i].width* boundRect[i].height;
		
         minEnclosingCircle( contours_poly[i], center[i], radius[i] );
		// area of circles
	     area1.at<float>(i,0)=(float)i;
		 area1.at<float>(i,1)= (float)(radius[i]*radius[i]);

		//moments of the contour
		mu[i]= moments(contours_poly[i], false);
		
		//center of the contour
		center_contours[i]= Point2f( mu[i].m10/mu[i].m00 , mu[i].m01/mu[i].m00 );
     }


  /// Draw polygonal contour + bonding rects + circles
	  Mat drawing = Mat::zeros( threshold_output.size(), CV_8UC3 );
	  Mat overlap = Mat::zeros( threshold_output.size(), CV_8UC3 );
  for( size_t i = 0; i< contours.size(); i++ )
     {
       Scalar color = Scalar( rng.uniform(0, 255), rng.uniform(0,255), rng.uniform(0,255) );
       //drawContours( drawing, contours_poly, (int)i, color, 1, 8, vector<Vec4i>(), 0, Point() );
//  try if something else can be used for comparison  e.g contourArea/RectArea
       if(area.at<float>(i,1)> minArea)
		{	
			 //draw the rectangle
			  rectangle( drawing, boundRect[i].tl(), boundRect[i].br(), color, 2, 8, 0 );
			 //calculate moments for the contour
			 // draw the enclosing circle
             // circle( drawing, center[i], (int)radius[i], color, 2, 8, 0 );
			 
			 //mark the center of the contour
			 //circle(drawing,center_contours[i],3, Scalar(255,0,0), -1,8,0 );
			  
			  images[i]= src(boundRect[i]);
			  count_contours +=1;
			  //mark the center of the enclosing circle
			  //circle( drawing, center[i], 3, Scalar(0,255,0), -1, 8, 0 );

			//  strcpy(destname, str1); itoa((int)i, destname, 10);
			//	strcat(destname, str2);
			oss<< str1 << i<< str2;
	        cout << oss.str() << endl;
				 
			 // imshow(oss.str(), images[i]);
			  oss.clear();
			  oss.str(""); 
		}
	
			   
     }
/*	for(size_t i=0;i <contours.size();i++)
	{		
			Mat mask = Mat::zeros(src.size(), CV_8UC1);
			drawContours(mask, contours, (int)i, Scalar(255), CV_FILLED);		
			Mat imageROI;
			src.copyTo(imageROI, mask);
			contourRegion[i]= imageROI(boundRect[i]);
	}*/
		
//printing areas of rectangles
/*	for(size_t i=0;i<contours.size(); i++)
	{
			cout<< " " << area.at<float>(i,0) <<  " " << area.at<float>(i,1) << endl;
	}

//	qsort(area.data, area.rows, sizeof(area.row(0)), compareforsort);
	
	for(size_t i=0;i<contours.size(); i++)
	{
			cout<< " " << area.at<float>(i,0) <<  " " << area.at<float>(i,1) << endl;
	}*/
	printf("count %d\n", count_contours);
  /// Show in a window
  namedWindow( "Contours" );
  //imshow( "Contours", drawing );
	imwrite("contours_.jpg", drawing);
	
	add(src, drawing, overlap);
	imshow("Contours", overlap);
	imwrite("overlap.jpg", overlap);
}